

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CWhileStm *stm)

{
  IExpression *pIVar1;
  IStatement *pIVar2;
  bool bVar3;
  TypeInfo *in_RCX;
  string *this_00;
  undefined1 local_a0 [8];
  string local_98;
  string errorMessage;
  undefined1 local_50 [40];
  
  std::operator<<((ostream *)&std::cout,"typechecker: CWhileStm\n");
  pIVar1 = (stm->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if ((pIVar1 == (IExpression *)0x0) ||
     ((stm->statement)._M_t.super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t
      .super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
      super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) {
    CError::CError((CError *)local_a0,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_a0);
    this_00 = (string *)local_a0;
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    TypeInfo::TypeInfo((TypeInfo *)local_a0,ERROR_TYPE);
    bVar3 = operator==(&this->lastCalculatedType,(TypeInfo *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    if (bVar3) {
      return;
    }
    if ((this->lastCalculatedType).type == BOOLEAN) {
      pIVar2 = (stm->statement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
      TypeInfo::TypeInfo((TypeInfo *)local_a0,VOID);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_a0);
      this_00 = (string *)(local_a0 + 8);
    }
    else {
      TypeInfo::TypeInfo((TypeInfo *)local_a0,BOOLEAN);
      TypeInfo::TypeInfo((TypeInfo *)local_50,(this->lastCalculatedType).type);
      CError::GetTypeErrorMessage_abi_cxx11_
                (&errorMessage,(CError *)local_a0,(TypeInfo *)local_50,in_RCX);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      CError::CError((CError *)local_a0,&errorMessage,
                     &(stm->super_IStatement).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      this_00 = &errorMessage;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CWhileStm &stm ) 
{
    std::cout << "typechecker: CWhileStm\n";

    if( stm.conditionExpression && stm.statement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( TypeInfo( enums::TPrimitiveType::BOOLEAN), lastCalculatedType.type );
			errors.push_back( CError( errorMessage, stm.position ) );
            return;
		}
        stm.statement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
	}
}